

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O0

RESTResponseFormat ParseDataFormat(string *param,string *strReq)

{
  bool bVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined8 in_RSI;
  size_type in_RDI;
  long in_FS_OFFSET;
  anon_struct_16_2_515363b0 *rf_name;
  anon_struct_16_2_515363b0 *__end1;
  anon_struct_16_2_515363b0 *__begin1;
  anon_struct_16_2_515363b0 (*__range1) [4];
  size_type pos_format;
  string suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  size_type in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  char __c;
  allocator<char> *in_stack_ffffffffffffff70;
  anon_struct_16_2_bf24d843 *paVar3;
  size_type in_stack_ffffffffffffff78;
  anon_struct_16_2_515363b0 *paVar4;
  anon_struct_16_2_bf24d843 *paVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  RESTResponseFormat local_50;
  allocator<char> local_49 [65];
  long local_8;
  
  __c = (char)((ulong)in_RSI >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
            (in_stack_ffffffffffffff48,__c,in_stack_ffffffffffffff40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (in_stack_ffffffffffffff48,__c,in_stack_ffffffffffffff40);
  if (sVar2 == 0xffffffffffffffff) {
    local_50 = UNDEF;
  }
  else {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar2 + 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff70);
    std::allocator<char>::~allocator(local_49);
    paVar3 = uri_prefixes;
    paVar4 = rf_names;
    while ((anon_struct_16_2_bf24d843 *)paVar4 != paVar3) {
      paVar5 = (anon_struct_16_2_bf24d843 *)paVar4;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                              in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff3c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff3c);
      if (bVar1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (this,in_RDI,CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        local_50 = *(RESTResponseFormat *)&((anon_struct_16_2_bf24d843 *)paVar4)->prefix;
        goto LAB_01255c79;
      }
      paVar4 = (anon_struct_16_2_515363b0 *)(paVar5 + 1);
    }
    local_50 = UNDEF;
LAB_01255c79:
    std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_50;
  }
  __stack_chk_fail();
}

Assistant:

RESTResponseFormat ParseDataFormat(std::string& param, const std::string& strReq)
{
    // Remove query string (if any, separated with '?') as it should not interfere with
    // parsing param and data format
    param = strReq.substr(0, strReq.rfind('?'));
    const std::string::size_type pos_format{param.rfind('.')};

    // No format string is found
    if (pos_format == std::string::npos) {
        return rf_names[0].rf;
    }

    // Match format string to available formats
    const std::string suffix(param, pos_format + 1);
    for (const auto& rf_name : rf_names) {
        if (suffix == rf_name.name) {
            param.erase(pos_format);
            return rf_name.rf;
        }
    }

    // If no suffix is found, return RESTResponseFormat::UNDEF and original string without query string
    return rf_names[0].rf;
}